

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
application::Chat::Chat(Chat *this,wstring *username,wstring *separator,wstring *prompt)

{
  anon_class_1_0_00000001 local_35 [13];
  wstring *local_28;
  wstring *prompt_local;
  wstring *separator_local;
  wstring *username_local;
  Chat *this_local;
  
  local_28 = prompt;
  prompt_local = separator;
  separator_local = username;
  username_local = &this->username_;
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)username);
  std::__cxx11::wstring::wstring((wstring *)&this->separator_,(wstring *)prompt_local);
  std::__cxx11::wstring::wstring((wstring *)&this->prompt_,(wstring *)local_28);
  std::__cxx11::wstring::wstring((wstring *)&this->input_);
  std::function<void_(application::Message)>::function(&this->sendMessageCallback_);
  std::function<void()>::
  function<application::Chat::Chat(std::__cxx11::wstring_const&,std::__cxx11::wstring_const&,std::__cxx11::wstring_const&)::__0,void>
            ((function<void()> *)&this->beforeExiting_,local_35);
  std::mutex::mutex(&this->mut);
  calcPrompt(this);
  return;
}

Assistant:

Chat::Chat(const std::wstring &username, const std::wstring &separator, const std::wstring &prompt) 
	: username_(username), separator_(separator), prompt_(prompt), beforeExiting_([]() {})
{
	calcPrompt();
}